

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)

{
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_object_tuple_t *psVar3;
  sysbvm_object_tuple_t *psVar4;
  
  aVar1 = (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).globalNamespace;
  sVar2 = (context->roots).defaultAnalysisQueueValueBox;
  psVar3 = *(sysbvm_object_tuple_t **)(sVar2 + 0x10);
  if (psVar3 == (sysbvm_object_tuple_t *)0x0) {
    psVar3 = sysbvm_context_allocatePointerTuple(context,(context->roots).analysisQueueType,2);
    *(sysbvm_object_tuple_t **)(sVar2 + 0x10) = psVar3;
  }
  psVar4 = sysbvm_context_allocatePointerTuple(context,(context->roots).environmentType,7);
  psVar4[2].header.field_0 = aVar1;
  *(sysbvm_object_tuple_t **)&psVar4[2].header.identityHashAndFlags = psVar3;
  return (sysbvm_tuple_t)psVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)
{
    return sysbvm_environment_createWithAnalysisQueue(context,
        sysbvm_environment_getIntrinsicsBuiltInEnvironment(context),
        sysbvm_analysisQueue_getDefault(context));
}